

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  char cVar11;
  ulong uVar12;
  
  uVar10 = num * 8;
  uVar8 = num * 8 + 3;
  if (this->unknown_ != (string *)0x0) {
    uVar12 = (ulong)uVar8;
    cVar11 = (char)this->unknown_;
    if (0x7f < uVar10) {
      do {
        std::__cxx11::string::push_back(cVar11);
        bVar7 = 0x3fff < uVar12;
        uVar12 = uVar12 >> 7;
      } while (bVar7);
    }
    std::__cxx11::string::push_back(cVar11);
  }
  iVar4 = ctx->depth_;
  ctx->depth_ = iVar4 + -1;
  if (0 < iVar4) {
    iVar5 = ctx->group_depth_;
    iVar1 = iVar5 + 1;
    ctx->group_depth_ = iVar1;
    pcVar9 = WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                       (this,ptr,ctx);
    if (pcVar9 != (char *)0x0) {
      if (iVar4 + -1 == ctx->depth_) {
        if (iVar1 == ctx->group_depth_) {
          ctx->group_depth_ = iVar5;
          ctx->depth_ = iVar4;
          uVar6 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          if (pcVar9 == (char *)0x0) {
            return (char *)0x0;
          }
          if (uVar6 != uVar8) {
            return (char *)0x0;
          }
          if (this->unknown_ == (string *)0x0) {
            return pcVar9;
          }
          uVar12 = (ulong)(uVar10 | 4);
          cVar11 = (char)this->unknown_;
          if (0x7f < uVar10) {
            do {
              std::__cxx11::string::push_back(cVar11);
              bVar7 = 0x3fff < uVar12;
              uVar12 = uVar12 >> 7;
            } while (bVar7);
          }
          std::__cxx11::string::push_back(cVar11);
          return pcVar9;
        }
      }
      else {
        ParseGroup();
      }
      ParseGroup();
    }
    uVar2 = ctx->depth_;
    uVar3 = ctx->group_depth_;
    ctx->depth_ = uVar2 + 1;
    ctx->group_depth_ = uVar3 + -1;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
  }
  return (char *)0x0;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroupInlined(ptr, num * 8 + 3, [&](const char* ptr) {
      return WireFormatParser(*this, ptr, ctx);
    });
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }